

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O2

data<Imath_3_2::half> * __thiscall
anon_unknown.dwarf_6c49c::data<Imath_3_2::half>::operator<<(data<Imath_3_2::half> *this,string *s)

{
  ArgExc *this_00;
  
  if (this->_started != true) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->_channels,s);
    return this;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"bug in test suite: cannot insert new channels here");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

data& operator<< (const string& s)
    {
        if (_started)
        {
            throw IEX_NAMESPACE::ArgExc (
                "bug in test suite: cannot insert new channels here");
        }
        _channels.push_back (s);
        return *this;
    }